

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHeader_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamHeader::CheckMagicNumber(BamHeader *this,BgzfStream *stream)

{
  size_t sVar1;
  BamException *pBVar2;
  allocator local_5e;
  allocator local_5d;
  char buffer [4];
  string local_58;
  string local_38;
  
  sVar1 = BgzfStream::Read(stream,buffer,4);
  if (sVar1 != 4) {
    pBVar2 = (BamException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_38,"BamHeader::CheckMagicNumber",&local_5d);
    std::__cxx11::string::string((string *)&local_58,"could not read magic number",&local_5e);
    BamException::BamException(pBVar2,&local_38,&local_58);
    __cxa_throw(pBVar2,&BamException::typeinfo,BamException::~BamException);
  }
  if (buffer == (char  [4])0x14d4142) {
    return;
  }
  pBVar2 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"BamHeader::CheckMagicNumber",&local_5d);
  std::__cxx11::string::string((string *)&local_58,"invalid magic number",&local_5e);
  BamException::BamException(pBVar2,&local_38,&local_58);
  __cxa_throw(pBVar2,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamHeader::CheckMagicNumber(BgzfStream* stream)
{

    // try to read magic number
    char buffer[Constants::BAM_HEADER_MAGIC_LENGTH];
    const std::size_t numBytesRead = stream->Read(buffer, Constants::BAM_HEADER_MAGIC_LENGTH);
    if (numBytesRead != (int)Constants::BAM_HEADER_MAGIC_LENGTH)
        throw BamException("BamHeader::CheckMagicNumber", "could not read magic number");

    // validate magic number
    if (!isValidMagicNumber(buffer))
        throw BamException("BamHeader::CheckMagicNumber", "invalid magic number");
}